

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_reader_extract_to_mem_no_alloc1
                  (mz_zip_archive *pZip,mz_uint file_index,void *pBuf,size_t buf_size,mz_uint flags,
                  void *pUser_read_buf,size_t user_read_buf_size,mz_zip_archive_file_stat *st)

{
  mz_bool mVar1;
  uint uVar2;
  size_t sVar3;
  mz_ulong mVar4;
  size_t local_26b0;
  size_t local_26a8;
  ulong local_26a0;
  size_t local_2698;
  size_t out_buf_size;
  size_t in_buf_size;
  tinfl_decompressor inflator;
  mz_uint8 *pLocal_header;
  mz_uint32 local_header_u32 [8];
  void *pRead_buf;
  mz_zip_archive_file_stat file_stat;
  mz_uint64 read_buf_avail;
  mz_uint64 read_buf_ofs;
  mz_uint64 read_buf_size;
  mz_uint64 out_buf_ofs;
  mz_uint64 comp_remaining;
  mz_uint64 cur_file_ofs;
  mz_uint64 needed_size;
  int status;
  void *pUser_read_buf_local;
  mz_uint flags_local;
  size_t buf_size_local;
  void *pBuf_local;
  mz_uint file_index_local;
  mz_zip_archive *pZip_local;
  
  read_buf_size = 0;
  read_buf_avail = 0;
  inflator._8368_8_ = &pLocal_header;
  if ((((pZip == (mz_zip_archive *)0x0) || (pZip->m_pState == (mz_zip_internal_state *)0x0)) ||
      ((buf_size != 0 && (pBuf == (void *)0x0)))) ||
     (((user_read_buf_size != 0 && (pUser_read_buf == (void *)0x0)) ||
      (pZip->m_pRead == (mz_file_read_func)0x0)))) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    }
    pZip_local._0_4_ = 0;
  }
  else {
    if (st == (mz_zip_archive_file_stat *)0x0) {
      mVar1 = mz_zip_reader_file_stat(pZip,file_index,(mz_zip_archive_file_stat *)&pRead_buf);
      if (mVar1 == 0) {
        return 0;
      }
    }
    else {
      memcpy(&pRead_buf,st,0x458);
    }
    if ((file_stat.m_local_header_ofs._4_4_ == 0) && (file_stat._24_8_ != 0)) {
      if ((file_stat.m_central_dir_ofs._4_2_ & 0x61) == 0) {
        if ((((flags & 0x400) == 0) && (file_stat.m_central_dir_ofs._6_2_ != 0)) &&
           (file_stat.m_central_dir_ofs._6_2_ != 8)) {
          if (pZip != (mz_zip_archive *)0x0) {
            pZip->m_last_error = MZ_ZIP_UNSUPPORTED_METHOD;
          }
          pZip_local._0_4_ = 0;
        }
        else {
          if ((flags & 0x400) == 0) {
            local_26a0 = file_stat.m_comp_size;
          }
          else {
            local_26a0 = file_stat._24_8_;
          }
          if (buf_size < local_26a0) {
            if (pZip != (mz_zip_archive *)0x0) {
              pZip->m_last_error = MZ_ZIP_BUF_TOO_SMALL;
            }
            pZip_local._0_4_ = 0;
          }
          else {
            sVar3 = (*pZip->m_pRead)(pZip->m_pIO_opaque,file_stat._48_8_,(void *)inflator._8368_8_,
                                     0x1e);
            if (sVar3 == 0x1e) {
              if (*(int *)inflator._8368_8_ == 0x4034b50) {
                comp_remaining =
                     (ulong)*(ushort *)(inflator._8368_8_ + 0x1a) + 0x1e +
                     (ulong)*(ushort *)(inflator._8368_8_ + 0x1c) + file_stat._48_8_;
                if (pZip->m_archive_size < comp_remaining + file_stat._24_8_) {
                  if (pZip != (mz_zip_archive *)0x0) {
                    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
                  }
                  pZip_local._0_4_ = 0;
                }
                else if (((flags & 0x400) == 0) && (file_stat.m_central_dir_ofs._6_2_ != 0)) {
                  in_buf_size._0_4_ = 0;
                  if (pZip->m_pState->m_pMem == (void *)0x0) {
                    if (pUser_read_buf == (void *)0x0) {
                      if ((ulong)file_stat._24_8_ < 0x10000) {
                        local_26a8 = file_stat._24_8_;
                      }
                      else {
                        local_26a8 = 0x10000;
                      }
                      read_buf_ofs = local_26a8;
                      local_header_u32._24_8_ =
                           (*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,local_26a8);
                      if ((void *)local_header_u32._24_8_ == (void *)0x0) {
                        if (pZip != (mz_zip_archive *)0x0) {
                          pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
                        }
                        return 0;
                      }
                      out_buf_ofs = file_stat._24_8_;
                    }
                    else {
                      if (user_read_buf_size == 0) {
                        return 0;
                      }
                      read_buf_ofs = user_read_buf_size;
                      out_buf_ofs = file_stat._24_8_;
                      local_header_u32._24_8_ = pUser_read_buf;
                    }
                    file_stat.m_time = 0;
                  }
                  else {
                    local_header_u32._24_8_ = (long)pZip->m_pState->m_pMem + comp_remaining;
                    file_stat.m_time = file_stat._24_8_;
                    read_buf_ofs = file_stat._24_8_;
                    out_buf_ofs = 0;
                  }
                  do {
                    local_2698 = file_stat.m_comp_size - read_buf_size;
                    if ((file_stat.m_time == 0) && (pZip->m_pState->m_pMem == (void *)0x0)) {
                      if (read_buf_ofs < out_buf_ofs) {
                        local_26b0 = read_buf_ofs;
                      }
                      else {
                        local_26b0 = out_buf_ofs;
                      }
                      file_stat.m_time = local_26b0;
                      sVar3 = (*pZip->m_pRead)(pZip->m_pIO_opaque,comp_remaining,
                                               (void *)local_header_u32._24_8_,local_26b0);
                      if (sVar3 != file_stat.m_time) {
                        needed_size._4_4_ = TINFL_STATUS_FAILED;
                        if (pZip != (mz_zip_archive *)0x0) {
                          pZip->m_last_error = MZ_ZIP_DECOMPRESSION_FAILED;
                        }
                        break;
                      }
                      comp_remaining = file_stat.m_time + comp_remaining;
                      out_buf_ofs = out_buf_ofs - file_stat.m_time;
                      read_buf_avail = 0;
                    }
                    out_buf_size = file_stat.m_time;
                    uVar2 = 0;
                    if (out_buf_ofs != 0) {
                      uVar2 = 2;
                    }
                    needed_size._4_4_ =
                         tinfl_decompress((tinfl_decompressor *)&in_buf_size,
                                          (mz_uint8 *)(local_header_u32._24_8_ + read_buf_avail),
                                          &out_buf_size,(mz_uint8 *)pBuf,
                                          (mz_uint8 *)((long)pBuf + read_buf_size),&local_2698,
                                          uVar2 | 4);
                    file_stat.m_time = file_stat.m_time - out_buf_size;
                    read_buf_avail = out_buf_size + read_buf_avail;
                    read_buf_size = local_2698 + read_buf_size;
                  } while (needed_size._4_4_ == TINFL_STATUS_NEEDS_MORE_INPUT);
                  if (needed_size._4_4_ == TINFL_STATUS_DONE) {
                    if (read_buf_size == file_stat.m_comp_size) {
                      mVar4 = mz_crc32(0,(mz_uint8 *)pBuf,file_stat.m_comp_size);
                      if (mVar4 != (uint)file_stat._16_4_) {
                        if (pZip != (mz_zip_archive *)0x0) {
                          pZip->m_last_error = MZ_ZIP_CRC_CHECK_FAILED;
                        }
                        needed_size._4_4_ = TINFL_STATUS_FAILED;
                      }
                    }
                    else {
                      if (pZip != (mz_zip_archive *)0x0) {
                        pZip->m_last_error = MZ_ZIP_UNEXPECTED_DECOMPRESSED_SIZE;
                      }
                      needed_size._4_4_ = TINFL_STATUS_FAILED;
                    }
                  }
                  if ((pZip->m_pState->m_pMem == (void *)0x0) && (pUser_read_buf == (void *)0x0)) {
                    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,(void *)local_header_u32._24_8_);
                  }
                  pZip_local._0_4_ = (uint)(needed_size._4_4_ == TINFL_STATUS_DONE);
                }
                else {
                  sVar3 = (*pZip->m_pRead)(pZip->m_pIO_opaque,comp_remaining,pBuf,local_26a0);
                  if (sVar3 == local_26a0) {
                    if (((flags & 0x400) == 0) &&
                       (mVar4 = mz_crc32(0,(mz_uint8 *)pBuf,file_stat.m_comp_size),
                       mVar4 != (uint)file_stat._16_4_)) {
                      if (pZip != (mz_zip_archive *)0x0) {
                        pZip->m_last_error = MZ_ZIP_CRC_CHECK_FAILED;
                      }
                      pZip_local._0_4_ = 0;
                    }
                    else {
                      pZip_local._0_4_ = 1;
                    }
                  }
                  else {
                    if (pZip != (mz_zip_archive *)0x0) {
                      pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
                    }
                    pZip_local._0_4_ = 0;
                  }
                }
              }
              else {
                if (pZip != (mz_zip_archive *)0x0) {
                  pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
                }
                pZip_local._0_4_ = 0;
              }
            }
            else {
              if (pZip != (mz_zip_archive *)0x0) {
                pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
              }
              pZip_local._0_4_ = 0;
            }
          }
        }
      }
      else {
        if (pZip != (mz_zip_archive *)0x0) {
          pZip->m_last_error = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
        }
        pZip_local._0_4_ = 0;
      }
    }
    else {
      pZip_local._0_4_ = 1;
    }
  }
  return (uint)pZip_local;
}

Assistant:

static mz_bool mz_zip_reader_extract_to_mem_no_alloc1(
    mz_zip_archive *pZip, mz_uint file_index, void *pBuf, size_t buf_size,
    mz_uint flags, void *pUser_read_buf, size_t user_read_buf_size,
    const mz_zip_archive_file_stat *st) {
  int status = TINFL_STATUS_DONE;
  mz_uint64 needed_size, cur_file_ofs, comp_remaining,
      out_buf_ofs = 0, read_buf_size, read_buf_ofs = 0, read_buf_avail;
  mz_zip_archive_file_stat file_stat;
  void *pRead_buf;
  mz_uint32
      local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) /
                       sizeof(mz_uint32)];
  mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;
  tinfl_decompressor inflator;

  if ((!pZip) || (!pZip->m_pState) || ((buf_size) && (!pBuf)) ||
      ((user_read_buf_size) && (!pUser_read_buf)) || (!pZip->m_pRead))
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

  if (st) {
    file_stat = *st;
  } else if (!mz_zip_reader_file_stat(pZip, file_index, &file_stat))
    return MZ_FALSE;

  /* A directory or zero length file */
  if ((file_stat.m_is_directory) || (!file_stat.m_comp_size))
    return MZ_TRUE;

  /* Encryption and patch files are not supported. */
  if (file_stat.m_bit_flag &
      (MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_IS_ENCRYPTED |
       MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_USES_STRONG_ENCRYPTION |
       MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_COMPRESSED_PATCH_FLAG))
    return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);

  /* This function only supports decompressing stored and deflate. */
  if ((!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (file_stat.m_method != 0) &&
      (file_stat.m_method != MZ_DEFLATED))
    return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_METHOD);

  /* Ensure supplied output buffer is large enough. */
  needed_size = (flags & MZ_ZIP_FLAG_COMPRESSED_DATA) ? file_stat.m_comp_size
                                                      : file_stat.m_uncomp_size;
  if (buf_size < needed_size)
    return mz_zip_set_error(pZip, MZ_ZIP_BUF_TOO_SMALL);

  /* Read and parse the local directory entry. */
  cur_file_ofs = file_stat.m_local_header_ofs;
  if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pLocal_header,
                    MZ_ZIP_LOCAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
    return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

  if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

  cur_file_ofs += (mz_uint64)(MZ_ZIP_LOCAL_DIR_HEADER_SIZE) +
                  MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS) +
                  MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
  if ((cur_file_ofs + file_stat.m_comp_size) > pZip->m_archive_size)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

  if ((flags & MZ_ZIP_FLAG_COMPRESSED_DATA) || (!file_stat.m_method)) {
    /* The file is stored or the caller has requested the compressed data. */
    if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf,
                      (size_t)needed_size) != needed_size)
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
    if ((flags & MZ_ZIP_FLAG_COMPRESSED_DATA) == 0) {
      if (mz_crc32(MZ_CRC32_INIT, (const mz_uint8 *)pBuf,
                   (size_t)file_stat.m_uncomp_size) != file_stat.m_crc32)
        return mz_zip_set_error(pZip, MZ_ZIP_CRC_CHECK_FAILED);
    }
#endif

    return MZ_TRUE;
  }

  /* Decompress the file either directly from memory or from a file input
   * buffer. */
  tinfl_init(&inflator);

  if (pZip->m_pState->m_pMem) {
    /* Read directly from the archive in memory. */
    pRead_buf = (mz_uint8 *)pZip->m_pState->m_pMem + cur_file_ofs;
    read_buf_size = read_buf_avail = file_stat.m_comp_size;
    comp_remaining = 0;
  } else if (pUser_read_buf) {
    /* Use a user provided read buffer. */
    if (!user_read_buf_size)
      return MZ_FALSE;
    pRead_buf = (mz_uint8 *)pUser_read_buf;
    read_buf_size = user_read_buf_size;
    read_buf_avail = 0;
    comp_remaining = file_stat.m_comp_size;
  } else {
    /* Temporarily allocate a read buffer. */
    read_buf_size =
        MZ_MIN(file_stat.m_comp_size, (mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE);
    if (((sizeof(size_t) == sizeof(mz_uint32))) && (read_buf_size > 0x7FFFFFFF))
      return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

    if (NULL == (pRead_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1,
                                            (size_t)read_buf_size)))
      return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    read_buf_avail = 0;
    comp_remaining = file_stat.m_comp_size;
  }

  do {
    /* The size_t cast here should be OK because we've verified that the output
     * buffer is >= file_stat.m_uncomp_size above */
    size_t in_buf_size,
        out_buf_size = (size_t)(file_stat.m_uncomp_size - out_buf_ofs);
    if ((!read_buf_avail) && (!pZip->m_pState->m_pMem)) {
      read_buf_avail = MZ_MIN(read_buf_size, comp_remaining);
      if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pRead_buf,
                        (size_t)read_buf_avail) != read_buf_avail) {
        status = TINFL_STATUS_FAILED;
        mz_zip_set_error(pZip, MZ_ZIP_DECOMPRESSION_FAILED);
        break;
      }
      cur_file_ofs += read_buf_avail;
      comp_remaining -= read_buf_avail;
      read_buf_ofs = 0;
    }
    in_buf_size = (size_t)read_buf_avail;
    status = tinfl_decompress(
        &inflator, (mz_uint8 *)pRead_buf + read_buf_ofs, &in_buf_size,
        (mz_uint8 *)pBuf, (mz_uint8 *)pBuf + out_buf_ofs, &out_buf_size,
        TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF |
            (comp_remaining ? TINFL_FLAG_HAS_MORE_INPUT : 0));
    read_buf_avail -= in_buf_size;
    read_buf_ofs += in_buf_size;
    out_buf_ofs += out_buf_size;
  } while (status == TINFL_STATUS_NEEDS_MORE_INPUT);

  if (status == TINFL_STATUS_DONE) {
    /* Make sure the entire file was decompressed, and check its CRC. */
    if (out_buf_ofs != file_stat.m_uncomp_size) {
      mz_zip_set_error(pZip, MZ_ZIP_UNEXPECTED_DECOMPRESSED_SIZE);
      status = TINFL_STATUS_FAILED;
    }
#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
    else if (mz_crc32(MZ_CRC32_INIT, (const mz_uint8 *)pBuf,
                      (size_t)file_stat.m_uncomp_size) != file_stat.m_crc32) {
      mz_zip_set_error(pZip, MZ_ZIP_CRC_CHECK_FAILED);
      status = TINFL_STATUS_FAILED;
    }
#endif
  }

  if ((!pZip->m_pState->m_pMem) && (!pUser_read_buf))
    pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);

  return status == TINFL_STATUS_DONE;
}